

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_stream.cpp
# Opt level: O0

void __thiscall create::SerialStream::processByte(SerialStream *this,uint8_t byteRead)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  undefined1 local_38 [16];
  undefined1 local_28 [31];
  uint8_t byteRead_local;
  SerialStream *this_local;
  
  this->numBytesRead = this->numBytesRead + '\x01';
  this->byteSum = this->byteSum + (uint)byteRead;
  local_28[0x17] = byteRead;
  unique0x10000375 = this;
  switch(this->readState) {
  case READ_HEADER:
    if (byteRead == this->headerByte) {
      this->readState = READ_NBYTES;
      this->byteSum = (uint)byteRead;
    }
    break;
  case READ_NBYTES:
    if (byteRead == this->expectedNumBytes) {
      this->readState = READ_PACKET_ID;
      this->numBytesRead = '\0';
    }
    else {
      this->readState = READ_HEADER;
    }
    break;
  case READ_PACKET_ID:
    this->packetID = byteRead;
    peVar2 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_Serial).data);
    bVar1 = Data::isValidPacketID(peVar2,this->packetID);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_Serial).data);
      Data::getPacket((Data *)local_28,(uint8_t)peVar2);
      peVar3 = std::__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
      this->expectedNumDataBytes = peVar3->nbytes;
      std::shared_ptr<create::Packet>::~shared_ptr((shared_ptr<create::Packet> *)local_28);
      bVar1 = true;
      if (this->expectedNumDataBytes != '\x01') {
        bVar1 = this->expectedNumDataBytes == '\x02';
      }
      if (!bVar1) {
        __assert_fail("expectedNumDataBytes == 1 || expectedNumDataBytes == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/AutonomyLab[P]libcreate/src/serial_stream.cpp"
                      ,0x35,"virtual void create::SerialStream::processByte(uint8_t)");
      }
      this->numDataBytesRead = '\0';
      this->packetBytes = 0;
      this->readState = READ_PACKET_BYTES;
    }
    else {
      this->readState = READ_HEADER;
    }
    break;
  case READ_PACKET_BYTES:
    this->numDataBytesRead = this->numDataBytesRead + '\x01';
    if ((this->expectedNumDataBytes == '\x02') && (this->numDataBytesRead == '\x01')) {
      this->packetBytes = (ushort)byteRead << 8;
    }
    else {
      this->packetBytes = this->packetBytes + (ushort)byteRead;
    }
    if (this->expectedNumDataBytes <= this->numDataBytesRead) {
      peVar2 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_Serial).data);
      Data::getPacket((Data *)local_38,(uint8_t)peVar2);
      peVar3 = std::__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
      Packet::setDataToValidate(peVar3,&this->packetBytes);
      std::shared_ptr<create::Packet>::~shared_ptr((shared_ptr<create::Packet> *)local_38);
      if (this->numBytesRead < this->expectedNumBytes) {
        this->readState = READ_PACKET_ID;
      }
      else {
        this->readState = READ_CHECKSUM;
      }
    }
    break;
  case READ_CHECKSUM:
    if ((this->byteSum & 0xff) == 0) {
      Serial::notifyDataReady(&this->super_Serial);
    }
    else {
      (this->super_Serial).corruptPackets = (this->super_Serial).corruptPackets + 1;
    }
    (this->super_Serial).totalPackets = (this->super_Serial).totalPackets + 1;
    this->readState = READ_HEADER;
  }
  return;
}

Assistant:

void SerialStream::processByte(uint8_t byteRead) {
    numBytesRead++;
    byteSum += byteRead;
    switch (readState) {
      case READ_HEADER:
        if (byteRead == headerByte) {
          readState = READ_NBYTES;
          byteSum = byteRead;
        }
        break;

      case READ_NBYTES:
        if (byteRead == expectedNumBytes) {
          readState = READ_PACKET_ID;
          numBytesRead = 0;
        }
        else {
          //notifyDataReady();
          readState = READ_HEADER;
        }
        break;

      case READ_PACKET_ID:
        packetID = byteRead;
        if (data->isValidPacketID(packetID)) {
          expectedNumDataBytes = data->getPacket(packetID)->nbytes;
          assert(expectedNumDataBytes == 1 || expectedNumDataBytes == 2);
          numDataBytesRead = 0;
          packetBytes = 0;
          readState = READ_PACKET_BYTES;
        }
        else {
          //notifyDataReady();
          readState = READ_HEADER;
        }
        break;

      case READ_PACKET_BYTES:
        numDataBytesRead++;
        if (expectedNumDataBytes == 2 && numDataBytesRead == 1) {
          // High byte first
          packetBytes = (byteRead << 8) & 0xff00;
        }
        else {
          // Low byte
          packetBytes += byteRead;
        }
        if (numDataBytesRead >= expectedNumDataBytes) {
          data->getPacket(packetID)->setDataToValidate(packetBytes);
          if (numBytesRead >= expectedNumBytes)
            readState = READ_CHECKSUM;
          else
            readState = READ_PACKET_ID;
        }
        break;

      case READ_CHECKSUM:
        if ((byteSum & 0xFF) == 0) {
          notifyDataReady();
        }
        else {
          // Corrupt data
          corruptPackets++;
        }
        totalPackets++;
        // Start again
        readState = READ_HEADER;
        break;
    } // end switch (readState)
  }